

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O0

int Kit_PlaGetCubeNum(char *pSop)

{
  int local_24;
  char *pcStack_20;
  int nCubes;
  char *pCur;
  char *pSop_local;
  
  local_24 = 0;
  pcStack_20 = pSop;
  if (pSop == (char *)0x0) {
    pSop_local._4_4_ = 0;
  }
  else {
    for (; *pcStack_20 != '\0'; pcStack_20 = pcStack_20 + 1) {
      local_24 = (uint)(*pcStack_20 == '\n') + local_24;
    }
    pSop_local._4_4_ = local_24;
  }
  return pSop_local._4_4_;
}

Assistant:

int Kit_PlaGetCubeNum( char * pSop )
{
    char * pCur;
    int nCubes = 0;
    if ( pSop == NULL )
        return 0;
    for ( pCur = pSop; *pCur; pCur++ )
        nCubes += (*pCur == '\n');
    return nCubes;
}